

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

Texture2DView
tcu::getEffectiveTView<tcu::Texture2DView>
          (Texture2DView *src,
          vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *storage
          ,Sampler *sampler)

{
  TextureFormat *pTVar1;
  undefined8 *puVar2;
  uint uVar3;
  pointer pCVar4;
  pointer pCVar5;
  uint uVar6;
  int levelNdx;
  long lVar7;
  long lVar8;
  Texture2DView TVar9;
  undefined1 local_58 [24];
  int aiStack_40 [2];
  void *local_38;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
            (storage,(long)src->m_numLevels);
  uVar3 = src->m_numLevels;
  pCVar4 = (storage->
           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar8 = 0;
  uVar6 = uVar3;
  for (lVar7 = 0; lVar7 < (int)uVar6; lVar7 = lVar7 + 1) {
    toSamplerAccess<tcu::ConstPixelBufferAccess>
              ((ConstPixelBufferAccess *)local_58,
               (ConstPixelBufferAccess *)((long)(src->m_levels->m_size).m_data + lVar8 + -8),
               sampler->depthStencilMode);
    pCVar5 = (storage->
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             )._M_impl.super__Vector_impl_data._M_start;
    *(void **)((long)(&pCVar5->m_pitch + 1) + lVar8) = local_38;
    puVar2 = (undefined8 *)((long)(pCVar5->m_size).m_data + lVar8 + 8);
    *puVar2 = local_58._16_8_;
    puVar2[1] = aiStack_40;
    pTVar1 = (TextureFormat *)((long)(pCVar5->m_size).m_data + lVar8 + -8);
    pTVar1->order = local_58._0_4_;
    pTVar1->type = local_58._4_4_;
    pTVar1[1].order = local_58._8_4_;
    pTVar1[1].type = local_58._12_4_;
    uVar6 = src->m_numLevels;
    lVar8 = lVar8 + 0x28;
  }
  TVar9._4_4_ = 0;
  TVar9.m_numLevels = uVar3;
  TVar9.m_levels = pCVar4;
  return TVar9;
}

Assistant:

ViewType getEffectiveTView (const ViewType& src, std::vector<tcu::ConstPixelBufferAccess>& storage, const tcu::Sampler& sampler)
{
	storage.resize(src.getNumLevels());

	ViewType view = ViewType(src.getNumLevels(), &storage[0]);

	for (int levelNdx = 0; levelNdx < src.getNumLevels(); ++levelNdx)
		storage[levelNdx] = tcu::getEffectiveDepthStencilAccess(src.getLevel(levelNdx), sampler.depthStencilMode);

	return view;
}